

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O2

uint __thiscall o3dgc::Arithmetic_Codec::get_bit(Arithmetic_Codec *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = this->value;
  uVar2 = this->length;
  uVar3 = uVar2 >> 1;
  this->length = uVar3;
  if (uVar3 <= uVar1) {
    this->value = uVar1 - uVar3;
  }
  if (uVar2 < 0x2000000) {
    renorm_dec_interval(this);
  }
  return (uint)(uVar3 <= uVar1);
}

Assistant:

unsigned Arithmetic_Codec::get_bit(void)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
    #endif

      length >>= 1;                                              // halve interval
      unsigned bit = (value >= length);                              // decode bit
      if (bit) value -= length;                                       // move base

      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      return bit;                                         // return data bit value
    }